

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::
     stringPrintfRecursive<pbrt::Bounds3<float>const&,pbrt::DenselySampledSpectrum_const&,pbrt::DenselySampledSpectrum_const&,float_const&,pbrt::HGPhaseFunction_const&,pbrt::Transform_const&,pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>const&,pbrt::Point3<int>const&>
               (string *s,char *fmt,Bounds3<float> *v,DenselySampledSpectrum *args,
               DenselySampledSpectrum *args_1,float *args_2,HGPhaseFunction *args_3,
               Transform *args_4,vector<float,_pstd::pmr::polymorphic_allocator<float>_> *args_5,
               Point3<int> *args_6)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  char *in_RCX;
  string *in_RDX;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *unaff_RBX;
  Transform *in_RDI;
  DenselySampledSpectrum *in_R8;
  DenselySampledSpectrum *in_R9;
  Point3<int> *unaff_retaddr;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  Bounds3<float> *in_stack_fffffffffffffd80;
  char *in_stack_fffffffffffffd88;
  string *in_stack_fffffffffffffda0;
  char **in_stack_fffffffffffffda8;
  char **in_stack_fffffffffffffdb0;
  Bounds3<float> *in_stack_fffffffffffffdb8;
  ostream *in_stack_fffffffffffffdc0;
  string local_218 [32];
  stringstream local_1f8 [16];
  char *in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe24;
  char *in_stack_fffffffffffffe28;
  LogLevel in_stack_fffffffffffffe34;
  string local_58 [16];
  HGPhaseFunction *in_stack_ffffffffffffffb8;
  float *in_stack_ffffffffffffffc0;
  
  copyToFormatString(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
  lVar1 = std::__cxx11::string::find((char)local_58,0x2a);
  lVar2 = std::__cxx11::string::find((char)local_58,0x73);
  lVar3 = std::__cxx11::string::find((char)local_58,100);
  if (lVar1 != -1) {
    LogFatal(in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,
             in_stack_fffffffffffffe18);
  }
  if (lVar3 != -1) {
    LogFatal(in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,
             in_stack_fffffffffffffe18);
  }
  if (lVar2 == -1) {
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) != 0) {
      LogFatal(in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,
               in_stack_fffffffffffffe18);
    }
    std::__cxx11::string::c_str();
    formatOne<pbrt::Bounds3<float>const&>(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
    std::__cxx11::string::operator+=((string *)in_RDI,(string *)&stack0xfffffffffffffda0);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffda0);
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1f8);
    pbrt::operator<<(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    std::__cxx11::string::c_str();
    std::__cxx11::stringstream::str();
    std::__cxx11::string::c_str();
    formatOne<char_const*>((char *)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
    std::__cxx11::string::operator+=((string *)in_RDI,local_218);
    std::__cxx11::string::~string(local_218);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffdc0);
    std::__cxx11::stringstream::~stringstream(local_1f8);
  }
  stringPrintfRecursive<pbrt::DenselySampledSpectrum_const&,pbrt::DenselySampledSpectrum_const&,float_const&,pbrt::HGPhaseFunction_const&,pbrt::Transform_const&,pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>const&,pbrt::Point3<int>const&>
            (in_RDX,in_RCX,in_R8,in_R9,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_RDI,
             unaff_RBX,unaff_retaddr);
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&... args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same<std::decay_t<T>, float>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, double>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, bool>::value)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}